

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O2

Unique<anurbs::Entry<anurbs::Line<3L>_>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::Line<3l>>,std::shared_ptr<anurbs::Line<3l>>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,shared_ptr<anurbs::Line<3L>_> *args,shared_ptr<anurbs::Attributes> *args_1)

{
  Entry<anurbs::Line<3L>_> *this_00;
  __shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<anurbs::Line<3L>,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (Entry<anurbs::Line<3L>_> *)operator_new(0x48);
  std::__shared_ptr<anurbs::Line<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&args->super___shared_ptr<anurbs::Line<3L>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,&args_1->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)
  ;
  Entry<anurbs::Line<3L>_>::Entry
            (this_00,(shared_ptr<anurbs::Line<3L>_> *)&local_38,
             (shared_ptr<anurbs::Attributes> *)&_Stack_48);
  *(Entry<anurbs::Line<3L>_> **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::Line<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Line<3L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::Line<3L>_>,_std::default_delete<anurbs::Entry<anurbs::Line<3L>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}